

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::State::State(State *this,int32_t hiddenSize,int32_t outputSize,int32_t seed)

{
  undefined4 *in_RDI;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 *__s;
  Vector *this_00;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  this_00 = (Vector *)(in_RDI + 4);
  Vector::Vector(this_00,in_stack_ffffffffffffffb8);
  Vector::Vector(this_00,in_stack_ffffffffffffffb8);
  __s = in_RDI + 0xc;
  Vector::Vector(this_00,(int64_t)__s);
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)this_00,
             (result_type)__s);
  return;
}

Assistant:

Model::State::State(int32_t hiddenSize, int32_t outputSize, int32_t seed)
    : lossValue_(0.0),
      nexamples_(0),
      hidden(hiddenSize),
      output(outputSize),
      grad(hiddenSize),
      rng(seed) {}